

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O3

uint64_t __thiscall fmp4_stream::mfhd::size(mfhd *this)

{
  return (ulong)((uint)(this->super_full_box).super_box.has_uuid_ * 0x10 +
                (uint)(this->super_full_box).super_box.is_large_ * 8) + 0x10;
}

Assistant:

uint64_t box::size()  const {
		uint64_t l_size = 8;
		if (is_large_)
			l_size += 8;
		if (has_uuid_)
			l_size += 16;
		return l_size;
	}